

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.c
# Opt level: O1

int connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  rxc_source_logic *source;
  rxc_sink_logic *sink;
  undefined4 in_register_0000003c;
  
  source = (rxc_source_logic *)malloc(0x28);
  if (source == (rxc_source_logic *)0x0) {
    source = (rxc_source_logic *)0x0;
  }
  else {
    source->source = (rxc_source *)CONCAT44(in_register_0000003c,__fd);
    source->dealloc = free;
    source->on_pull = on_pull;
    source->on_downstream_finish = on_downstream_finish;
  }
  sink = (rxc_sink_logic *)(**(code **)(__addr->sa_data + 6))(__addr);
  rxc_connection_create(source,sink);
  iVar1 = (*sink->on_connect)(sink);
  return iVar1;
}

Assistant:

static void connect(struct rxc_source *self, struct rxc_sink *sink)
{
    struct rxc_source_logic *source_logic = create_logic(self);
    struct rxc_sink_logic *sink_logic = sink->create_logic(sink);

    rxc_connection_create(source_logic, sink_logic);
    sink_logic->on_connect(sink_logic);
}